

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

string * __thiscall
Kernel::getQuantifiedStr<Lib::Set<unsigned_int,Lib::DefaultHash>>
          (string *__return_storage_ptr__,Kernel *this,Set<unsigned_int,_Lib::DefaultHash> *vars,
          string *inner,
          DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *t_map,
          bool innerParentheses)

{
  bool bVar1;
  string *__return_storage_ptr___00;
  char cVar2;
  bool bVar3;
  uint i;
  uint i_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Iterator it;
  uint var;
  VirtualIterator<unsigned_int> vit;
  TermList t;
  string ty;
  string varStr;
  uint local_148;
  allocator<char> local_141;
  Cell local_140;
  Set<unsigned_int,_Lib::DefaultHash> *local_138;
  undefined4 local_12c;
  string *local_128;
  string local_120;
  TermList local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_12c = SUB84(t_map,0);
  it._last = *(Cell **)(this + 0x10);
  it._next = &local_140;
  local_138 = vars;
  local_128 = __return_storage_ptr__;
  local_98 = (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)inner;
  Lib::pvi<Lib::Set<unsigned_int,Lib::DefaultHash>::Iterator>(it);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  bVar1 = true;
  while( true ) {
    cVar2 = (**(code **)(*(long *)local_140 + 0x10))();
    __return_storage_ptr___00 = local_128;
    if (cVar2 == '\0') break;
    local_148 = (**(code **)(*(long *)local_140 + 0x18))();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"",(allocator<char> *)&local_f8);
    local_100._content = 2;
    bVar3 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                      (local_98,&local_148,&local_100);
    if (bVar3) {
      bVar3 = Problem::hasNonDefaultSorts(DAT_00a141e8);
      if (bVar3) {
        TermList::toString_abi_cxx11_(&local_120,&local_100,false);
        std::operator+(&local_f8," : ",&local_120);
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_120);
      }
    }
    bVar3 = std::operator==(&local_d8," : $tType");
    if (bVar3) {
      if (!bVar1) {
        std::operator+(&local_f8,",",&local_b8);
        std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"X",&local_141);
      Lib::Int::toString_abi_cxx11_(&local_70,(Int *)(ulong)local_148,i);
      std::operator+(&local_50,&local_90,&local_70);
      std::operator+(&local_120,&local_50,&local_d8);
      std::operator+(&local_f8,&local_120,&local_b8);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_90;
    }
    else {
      if (!bVar1) {
        std::__cxx11::string::append((char *)&local_b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"X",(allocator<char> *)&local_70);
      Lib::Int::toString_abi_cxx11_(&local_90,(Int *)(ulong)local_148,i_00);
      std::operator+(&local_120,&local_50,&local_90);
      std::operator+(&local_f8,&local_120,&local_d8);
      std::__cxx11::string::append((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_90);
      this_00 = &local_50;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)&local_d8);
    bVar1 = false;
  }
  if (bVar1) {
    std::__cxx11::string::string((string *)local_128,(string *)local_138);
  }
  else {
    if ((char)local_12c == '\0') {
      std::operator+(&local_120,"( ! [",&local_b8);
      std::operator+(&local_f8,&local_120,"] : ");
      std::operator+(&local_d8,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
      ;
      std::operator+(__return_storage_ptr___00,&local_d8," )");
    }
    else {
      std::operator+(&local_120,"( ! [",&local_b8);
      std::operator+(&local_f8,&local_120,"] : (");
      std::operator+(&local_d8,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
      ;
      std::operator+(__return_storage_ptr___00,&local_d8,") )");
    }
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_120);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  Lib::VirtualIterator<unsigned_int>::~VirtualIterator((VirtualIterator<unsigned_int> *)&local_140);
  return __return_storage_ptr___00;
}

Assistant:

std::string getQuantifiedStr(const VarContainer& vars, std::string inner, DHMap<unsigned,TermList>& t_map, bool innerParentheses=true){
  VirtualIterator<unsigned> vit=pvi( getContentIterator(vars) );
  std::string varStr;
  bool first=true;
  while(vit.hasNext()) {
    unsigned var =vit.next();
    std::string ty="";
    TermList t;

    if(t_map.find(var,t) && env.getMainProblem()->hasNonDefaultSorts()){
      //hasNonDefaultSorts is true if the problem contains a sort
      //that is not $i and not a variable
      ty=" : " + t.toString();
    }
    if(ty == " : $tType"){
      if (!first) { varStr = "," + varStr; }
      varStr=std::string("X")+Int::toString(var)+ty + varStr;
    } else {
      if (!first) { varStr+=","; }
      varStr+=std::string("X")+Int::toString(var)+ty;
    }
    first=false;
  }

  if (first) {
    //we didn't quantify any variable
    return inner;
  }

  if (innerParentheses) {
    return "( ! ["+varStr+"] : ("+inner+") )";
  }
  else {
    return "( ! ["+varStr+"] : "+inner+" )";
  }
}